

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

bool __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::read_from_stream
          (array_n<float,_3,_std::allocator<float>_> *this,ifstream *stream)

{
  bool bVar1;
  long lVar2;
  undefined8 uStack_30;
  uint sig;
  uint _in_dims [3];
  
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) {
    return false;
  }
  sig = 0;
  uStack_30 = 0x147267;
  std::istream::read((char *)stream,(long)&sig);
  if (sig == 0x53534c41) {
    uStack_30 = 0x147280;
    std::istream::read((char *)stream,(long)_in_dims);
    for (lVar2 = 2; lVar2 != 5; lVar2 = lVar2 + 1) {
      if (*(uint *)((long)&uStack_30 + lVar2 * 4 + 4) != this->_dims[lVar2 + -2]) goto LAB_0014729e;
    }
    uStack_30 = 0x1472b3;
    std::istream::read((char *)stream,(long)this->_array);
    bVar1 = true;
  }
  else {
LAB_0014729e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 1;

            stream.read((char *)&sig, sizeof(unsigned int));

            if(sig != 0x53534c41) return false;
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));

            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
                size *= _dims[i];
            }

            stream.read((char *)_array, size*sizeof(T));
            return true;
        }